

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_extract.cpp
# Opt level: O3

void __thiscall
FNodeBuilder::Extract
          (FNodeBuilder *this,node_t **outNodes,int *nodeCount,seg_t **outSegs,
          glsegextra_t **outSegExtras,int *segCount,subsector_t **outSubs,int *subCount,
          vertex_t **outVerts,int *vertCount)

{
  undefined8 uVar1;
  FPrivVert *pFVar2;
  FPrivSeg *pFVar3;
  side_t *psVar4;
  line_t *plVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  DVector2 DVar11;
  double dVar12;
  sector_t *psVar13;
  bool bVar14;
  int iVar15;
  vertex_t *pvVar16;
  size_t __n;
  subsector_t *psVar17;
  node_t *pnVar18;
  ulong uVar19;
  seg_t *psVar20;
  glsegextra_t *pgVar21;
  glseg_t *pgVar22;
  DWORD DVar23;
  long lVar24;
  USegPtr *pUVar25;
  long lVar26;
  long lVar27;
  uint uVar28;
  bool bVar29;
  vertex_t *pvVar30;
  long lVar31;
  glseg_t *pgVar32;
  size_t sVar33;
  undefined8 *puVar34;
  long lVar35;
  node_t *pnVar36;
  ulong uVar37;
  byte bVar38;
  TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> local_50;
  glsegextra_t **local_40;
  size_t local_38;
  
  bVar38 = 0;
  uVar28 = (this->Vertices).Count;
  uVar37 = (ulong)(int)uVar28;
  *vertCount = uVar28;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar37;
  uVar19 = 0xffffffffffffffff;
  if (SUB168(auVar6 * ZEXT816(0x38),8) == 0) {
    uVar19 = SUB168(auVar6 * ZEXT816(0x38),0);
  }
  local_40 = outSegExtras;
  pvVar16 = (vertex_t *)operator_new__(uVar19);
  if (uVar37 == 0) {
    *outVerts = pvVar16;
  }
  else {
    pvVar30 = pvVar16;
    do {
      (pvVar30->p).X = 0.0;
      (pvVar30->p).Y = 0.0;
      pvVar30->viewangle = 0;
      pvVar30->angletime = 0;
      pvVar30->dirty = true;
      pvVar30->numheights = 0;
      pvVar30->numsectors = 0;
      pvVar30->sectors = (sector_t **)0x0;
      pvVar30->heightlist = (float *)0x0;
      pvVar30 = pvVar30 + 1;
    } while (pvVar30 != pvVar16 + uVar37);
    *outVerts = pvVar16;
    if (0 < (int)uVar28) {
      pFVar2 = (this->Vertices).Array;
      lVar26 = 0;
      do {
        uVar1 = *(undefined8 *)((long)&(pFVar2->super_FSimpleVert).x + lVar26);
        dVar12 = (double)(int)((ulong)uVar1 >> 0x20) * 1.52587890625e-05;
        DVar11.Y._0_4_ = SUB84(dVar12,0);
        DVar11.X = (double)(int)uVar1 * 1.52587890625e-05;
        DVar11.Y._4_4_ = (int)((ulong)dVar12 >> 0x20);
        pvVar16->p = DVar11;
        pvVar16 = pvVar16 + 1;
        lVar26 = lVar26 + 0x10;
      } while (uVar37 * 0x10 != lVar26);
    }
  }
  uVar28 = (this->Subsectors).Count;
  *subCount = uVar28;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (long)(int)uVar28;
  __n = SUB168(auVar7 * ZEXT816(0x60),0);
  sVar33 = __n;
  if (SUB168(auVar7 * ZEXT816(0x60),8) != 0) {
    sVar33 = 0xffffffffffffffff;
  }
  psVar17 = (subsector_t *)operator_new__(sVar33);
  *outSubs = psVar17;
  memset(psVar17,0,__n);
  uVar28 = (this->Nodes).Count;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (long)(int)uVar28;
  local_38 = SUB168(auVar8 * ZEXT816(0x48),0);
  *nodeCount = uVar28;
  uVar19 = 0xffffffffffffffff;
  if (SUB168(auVar8 * ZEXT816(0x48),8) == 0) {
    uVar19 = local_38;
  }
  pnVar18 = (node_t *)operator_new__(uVar19);
  *outNodes = pnVar18;
  memcpy(pnVar18,(this->Nodes).Array,local_38);
  if (0 < (long)(int)uVar28) {
    lVar26 = 0x10;
    lVar24 = 0;
    lVar27 = 0;
    do {
      lVar31 = 0;
      do {
        pnVar18 = *outNodes;
        uVar28 = *(uint *)((long)&pnVar18->field_6 + lVar31 * 4 + lVar24 + 4);
        pnVar36 = (node_t *)((long)&(*outSubs)[uVar28 & 0x7fffffff].sector + 1);
        if (-1 < (int)uVar28) {
          pnVar36 = pnVar18 + uVar28;
        }
        *(node_t **)((long)&pnVar18->field_6 + lVar31 * 8 + lVar24 + 8) = pnVar36;
        lVar31 = lVar31 + -1;
      } while (lVar31 != -2);
      lVar31 = 0;
      bVar14 = true;
      do {
        bVar29 = bVar14;
        lVar31 = lVar31 * 0x10 + lVar26;
        lVar35 = 0;
        do {
          *(float *)((long)&(*outNodes)->x + lVar35 * 4 + lVar31) =
               (float)*(int *)((long)&(*outNodes)->x + lVar35 * 4 + lVar31) * 1.5258789e-05;
          lVar35 = lVar35 + 1;
        } while (lVar35 != 4);
        lVar31 = 1;
        bVar14 = false;
      } while (bVar29);
      lVar27 = lVar27 + 1;
      lVar24 = lVar24 + 0x48;
      lVar26 = lVar26 + 0x48;
    } while (lVar27 < *nodeCount);
  }
  if (this->GLNodes == true) {
    local_50.Most = (this->Segs).Count * 5 >> 2;
    local_50.Count = 0;
    local_50.Array =
         (glseg_t *)
         M_Malloc_Dbg((ulong)local_50.Most * 0x50,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/tarray.h"
                      ,0x91);
    if (*subCount < 1) {
      uVar28 = 0;
    }
    else {
      lVar26 = 0x28;
      lVar24 = 0;
      do {
        iVar15 = CloseSubsector(this,&local_50,(int)lVar24,*outVerts);
        psVar17 = *outSubs;
        *(int *)((long)&((subsector_t *)(psVar17->portalcoverage + -4))->sector + lVar26) = iVar15;
        *(ulong *)((long)(psVar17->portalcoverage + -5) + lVar26) = (ulong)(local_50.Count - iVar15)
        ;
        lVar24 = lVar24 + 1;
        lVar26 = lVar26 + 0x60;
        uVar28 = local_50.Count;
      } while (lVar24 < *subCount);
    }
    *segCount = uVar28;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = (long)(int)uVar28;
    uVar19 = SUB168(auVar10 * ZEXT816(0x48),0);
    if (SUB168(auVar10 * ZEXT816(0x48),8) != 0) {
      uVar19 = 0xffffffffffffffff;
    }
    psVar20 = (seg_t *)operator_new__(uVar19);
    *outSegs = psVar20;
    uVar19 = (long)(int)uVar28 << 4;
    if ((int)uVar28 < 0) {
      uVar19 = 0xffffffffffffffff;
    }
    pgVar21 = (glsegextra_t *)operator_new__(uVar19);
    *local_40 = pgVar21;
    if (0 < (int)uVar28) {
      lVar26 = 0;
      lVar24 = 0;
      lVar27 = 0;
      pgVar22 = local_50.Array;
      do {
        pgVar32 = pgVar22;
        puVar34 = (undefined8 *)((long)&(*outSegs)->v1 + lVar26);
        for (lVar31 = 9; lVar31 != 0; lVar31 = lVar31 + -1) {
          *puVar34 = (pgVar32->super_seg_t).v1;
          pgVar32 = (glseg_t *)((long)pgVar32 + (ulong)bVar38 * -0x10 + 8);
          puVar34 = puVar34 + (ulong)bVar38 * -2 + 1;
        }
        if ((ulong)pgVar22->Partner == 0xffffffff) {
          DVar23 = 0xffffffff;
        }
        else {
          DVar23 = (this->Segs).Array[pgVar22->Partner].storedseg;
        }
        *(DWORD *)((long)&(*local_40)->PartnerSeg + lVar24) = DVar23;
        lVar27 = lVar27 + 1;
        lVar24 = lVar24 + 0x10;
        lVar26 = lVar26 + 0x48;
        pgVar22 = pgVar22 + 1;
      } while (lVar27 < *segCount);
    }
    TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t>::~TArray(&local_50);
  }
  else {
    memcpy(*outSubs,(this->Subsectors).Array,(long)*subCount * 0x60);
    uVar28 = (this->Segs).Count;
    uVar37 = (ulong)(int)uVar28;
    *segCount = uVar28;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar37;
    uVar19 = 0xffffffffffffffff;
    if (SUB168(auVar9 * ZEXT816(0x48),8) == 0) {
      uVar19 = SUB168(auVar9 * ZEXT816(0x48),0);
    }
    psVar20 = (seg_t *)operator_new__(uVar19);
    *outSegs = psVar20;
    *local_40 = (glsegextra_t *)0x0;
    if (0 < (long)uVar37) {
      pFVar3 = (this->Segs).Array;
      pUVar25 = (this->SegList).Array;
      psVar4 = this->Level->Sides;
      plVar5 = this->Level->Lines;
      lVar26 = 0;
      do {
        uVar28 = pUVar25->SegNum;
        psVar20 = *outSegs;
        *(vertex_t **)((long)&psVar20->v1 + lVar26) = *outVerts + pFVar3[uVar28].v1;
        *(vertex_t **)((long)&psVar20->v2 + lVar26) = *outVerts + pFVar3[uVar28].v2;
        psVar13 = (&pFVar3[uVar28].frontsector)[1];
        puVar34 = (undefined8 *)((long)&psVar20->frontsector + lVar26);
        *puVar34 = pFVar3[uVar28].frontsector;
        puVar34[1] = psVar13;
        *(line_t **)((long)&psVar20->linedef + lVar26) = plVar5 + pFVar3[uVar28].linedef;
        *(side_t **)((long)&psVar20->sidedef + lVar26) = psVar4 + pFVar3[uVar28].sidedef;
        lVar26 = lVar26 + 0x48;
        pUVar25 = (USegPtr *)(&pUVar25->SegNum + 2);
      } while (uVar37 * 0x48 != lVar26);
    }
  }
  iVar15 = *subCount;
  if (0 < (long)iVar15) {
    lVar26 = 0;
    do {
      *(seg_t **)((long)(*outSubs)->portalcoverage + lVar26 + -0x28) =
           *outSegs + *(long *)((long)(*outSubs)->portalcoverage + lVar26 + -0x28);
      lVar26 = lVar26 + 0x60;
    } while ((long)iVar15 * 0x60 != lVar26);
  }
  lVar26 = (long)this->Level->NumLines;
  if (0 < lVar26) {
    plVar5 = this->Level->Lines;
    lVar24 = 0;
    do {
      *(vertex_t **)((long)plVar5->args + lVar24 + -0x2c) =
           *outVerts + *(long *)((long)plVar5->args + lVar24 + -0x2c);
      *(vertex_t **)((long)plVar5->args + lVar24 + -0x24) =
           *outVerts + *(long *)((long)plVar5->args + lVar24 + -0x24);
      lVar24 = lVar24 + 0x98;
    } while (lVar26 * 0x98 - lVar24 != 0);
  }
  return;
}

Assistant:

void FNodeBuilder::Extract (node_t *&outNodes, int &nodeCount,
	seg_t *&outSegs, glsegextra_t *&outSegExtras, int &segCount,
	subsector_t *&outSubs, int &subCount,
	vertex_t *&outVerts, int &vertCount)
{
	int i;

	vertCount = Vertices.Size ();
	outVerts = new vertex_t[vertCount];

	for (i = 0; i < vertCount; ++i)
	{
		outVerts[i].set(Vertices[i].x, Vertices[i].y);
	}

	subCount = Subsectors.Size();
	outSubs = new subsector_t[subCount];
	memset(outSubs, 0, subCount * sizeof(subsector_t));

	nodeCount = Nodes.Size ();
	outNodes = new node_t[nodeCount];

	memcpy (outNodes, &Nodes[0], nodeCount*sizeof(node_t));
	for (i = 0; i < nodeCount; ++i)
	{
		D(Printf(PRINT_LOG, "Node %d:  Splitter[%08x,%08x] [%08x,%08x]\n", i,
			outNodes[i].x, outNodes[i].y, outNodes[i].dx, outNodes[i].dy));
		// Go backwards because on 64-bit systems, both of the intchildren are
		// inside the first in-game child.
		for (int j = 1; j >= 0; --j)
		{
			if (outNodes[i].intchildren[j] & 0x80000000)
			{
				D(Printf(PRINT_LOG, "  subsector %d\n", outNodes[i].intchildren[j] & 0x7FFFFFFF));
				outNodes[i].children[j] = (BYTE *)(outSubs + (outNodes[i].intchildren[j] & 0x7fffffff)) + 1;
			}
			else
			{
				D(Printf(PRINT_LOG, "  node %d\n", outNodes[i].intchildren[j]));
				outNodes[i].children[j] = outNodes + outNodes[i].intchildren[j];
			}
		}
		for (int j = 0; j < 2; ++j)
		{
			for (int k = 0; k < 4; ++k)
			{
				outNodes[i].bbox[j][k] = FIXED2FLOAT(outNodes[i].nb_bbox[j][k]);
			}
		}
	}

	if (GLNodes)
	{
		TArray<glseg_t> segs (Segs.Size()*5/4);

		for (i = 0; i < subCount; ++i)
		{
			DWORD numsegs = CloseSubsector (segs, i, outVerts);
			outSubs[i].numlines = numsegs;
			outSubs[i].firstline = (seg_t *)(size_t)(segs.Size() - numsegs);
		}

		segCount = segs.Size ();
		outSegs = new seg_t[segCount];
		outSegExtras = new glsegextra_t[segCount];

		for (i = 0; i < segCount; ++i)
		{
			outSegs[i] = *(seg_t *)&segs[i];

			if (segs[i].Partner != DWORD_MAX)
			{
				outSegExtras[i].PartnerSeg = Segs[segs[i].Partner].storedseg;
			}
			else
			{
				outSegExtras[i].PartnerSeg = DWORD_MAX;
			}
		}
	}
	else
	{
		memcpy (outSubs, &Subsectors[0], subCount*sizeof(subsector_t));
		segCount = Segs.Size ();
		outSegs = new seg_t[segCount];
		outSegExtras = NULL;
		for (i = 0; i < segCount; ++i)
		{
			const FPrivSeg *org = &Segs[SegList[i].SegNum];
			seg_t *out = &outSegs[i];

			D(Printf(PRINT_LOG, "Seg %d: v1(%d) -> v2(%d)\n", i, org->v1, org->v2));

			out->v1 = outVerts + org->v1;
			out->v2 = outVerts + org->v2;
			out->backsector = org->backsector;
			out->frontsector = org->frontsector;
			out->linedef = Level.Lines + org->linedef;
			out->sidedef = Level.Sides + org->sidedef;
		}
	}
	for (i = 0; i < subCount; ++i)
	{
		outSubs[i].firstline = &outSegs[(size_t)outSubs[i].firstline];
	}

	D(Printf("%i segs, %i nodes, %i subsectors\n", segCount, nodeCount, subCount));

	for (i = 0; i < Level.NumLines; ++i)
	{
		Level.Lines[i].v1 = outVerts + (size_t)Level.Lines[i].v1;
		Level.Lines[i].v2 = outVerts + (size_t)Level.Lines[i].v2;
	}
}